

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O3

void __thiscall
spdlog::sinks::rotating_file_sink<std::mutex>::rotate_now(rotating_file_sink<std::mutex> *this)

{
  mutex *__mutex;
  int iVar1;
  
  __mutex = &(this->super_base_sink<std::mutex>).mutex_;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    rotate_(this);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

SPDLOG_INLINE void rotating_file_sink<Mutex>::rotate_now() {
    std::lock_guard<Mutex> lock(base_sink<Mutex>::mutex_);
    rotate_();
}